

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationShaderInputOutputTests.cpp
# Opt level: O0

TestStatus *
vkt::tessellation::anon_unknown_1::PatchVertexCount::test
          (TestStatus *__return_storage_ptr__,Context *context,CaseDefinition *caseDef)

{
  int inPatchSize;
  int outPatchSize;
  size_t vertexDataSizeBytes;
  size_type sVar1;
  TestContext *this;
  Archive *archive;
  char *fileName;
  reference vertexData_00;
  ConstPixelBufferAccess local_b0;
  undefined4 local_84;
  undefined1 local_80 [4];
  int numPrimitives;
  TextureLevel referenceImage;
  VkDeviceSize vertexBufferSize;
  int local_48;
  float f;
  int i;
  undefined1 local_38 [8];
  vector<float,_std::allocator<float>_> vertexData;
  CaseDefinition *caseDef_local;
  Context *context_local;
  
  vertexData.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)caseDef;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_38);
  std::vector<float,_std::allocator<float>_>::reserve
            ((vector<float,_std::allocator<float>_> *)local_38,(long)caseDef->inPatchSize);
  for (local_48 = 0; local_48 < caseDef->inPatchSize; local_48 = local_48 + 1) {
    vertexBufferSize._4_4_ = (float)local_48 / (float)(caseDef->inPatchSize + -1);
    vertexBufferSize._0_4_ = vertexBufferSize._4_4_ * vertexBufferSize._4_4_;
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)local_38,
               (value_type_conflict2 *)&vertexBufferSize);
  }
  sVar1 = std::vector<float,_std::allocator<float>_>::size
                    ((vector<float,_std::allocator<float>_> *)local_38);
  referenceImage.m_data.m_cap = sVar1 << 2;
  tcu::TextureLevel::TextureLevel((TextureLevel *)local_80);
  this = Context::getTestContext(context);
  archive = tcu::TestContext::getArchive(this);
  fileName = (char *)std::__cxx11::string::c_str();
  tcu::ImageIO::loadPNG((TextureLevel *)local_80,archive,fileName);
  local_84 = 1;
  inPatchSize = caseDef->inPatchSize;
  outPatchSize = caseDef->outPatchSize;
  vertexData_00 =
       std::vector<float,_std::allocator<float>_>::operator[]
                 ((vector<float,_std::allocator<float>_> *)local_38,0);
  vertexDataSizeBytes = referenceImage.m_data.m_cap;
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_b0,(TextureLevel *)local_80);
  runTest(__return_storage_ptr__,context,1,inPatchSize,outPatchSize,VK_FORMAT_R32_SFLOAT,
          vertexData_00,vertexDataSizeBytes,&local_b0);
  tcu::TextureLevel::~TextureLevel((TextureLevel *)local_80);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus test (Context& context, const CaseDefinition caseDef)
{
	// Input vertex attribute data
	std::vector<float> vertexData;
	vertexData.reserve(caseDef.inPatchSize);
	for (int i = 0; i < caseDef.inPatchSize; ++i)
	{
		const float f = static_cast<float>(i) / static_cast<float>(caseDef.inPatchSize - 1);
		vertexData.push_back(f*f);
	}
	const VkDeviceSize vertexBufferSize = sizeof(float) * vertexData.size();

	// Load reference image
	tcu::TextureLevel referenceImage;
	tcu::ImageIO::loadPNG(referenceImage, context.getTestContext().getArchive(), caseDef.referenceImagePath.c_str());

	const int numPrimitives = 1;

	return runTest(context, numPrimitives, caseDef.inPatchSize, caseDef.outPatchSize,
				   VK_FORMAT_R32_SFLOAT, &vertexData[0], vertexBufferSize, referenceImage.getAccess());
}